

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COSOperator.cpp
# Opt level: O2

c8 * __thiscall irr::COSOperator::getTextFromPrimarySelection(COSOperator *this)

{
  return (c8 *)0x0;
}

Assistant:

const c8 *COSOperator::getTextFromPrimarySelection() const
{
#if defined(_IRR_COMPILE_WITH_SDL_DEVICE_)
#if SDL_VERSION_ATLEAST(2, 25, 0)
	if (sdl_supports_primary_selection) {
		SDL_free(PrimarySelectionText);
		PrimarySelectionText = SDL_GetPrimarySelectionText();
		return PrimarySelectionText;
	}
#endif
	return 0;

#elif defined(_IRR_COMPILE_WITH_X11_DEVICE_)
	if (IrrDeviceLinux)
		return IrrDeviceLinux->getTextFromPrimarySelection();
	return 0;

#else

	return 0;
#endif
}